

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_test.cpp
# Opt level: O0

void jhu::thrax::anon_unknown_8::expectNode(IndexType s,IndexType e,char *l,Node *n,Node actual)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  Node *pNStack_20;
  Span sp;
  Node *n_local;
  char *l_local;
  IndexType e_local;
  IndexType s_local;
  
  gtest_ar.message_.ptr_._4_2_ = s;
  gtest_ar.message_.ptr_._6_2_ = e;
  pNStack_20 = n;
  n_local = (Node *)l;
  l_local._4_2_ = e;
  l_local._6_2_ = s;
  testing::internal::EqHelper<false>::Compare<jhu::thrax::Span,jhu::thrax::Span>
            ((EqHelper<false> *)local_38,"sp","actual.span",
             (Span *)((long)&gtest_ar.message_.ptr_ + 4),&actual.span);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
               ,0xb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  testing::internal::EqHelper<false>::
  Compare<char_const*,std::basic_string_view<char,std::char_traits<char>>>
            ((EqHelper<false> *)local_68,"l","actual.label",(char **)&n_local,&actual.label);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
               ,0xc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  testing::internal::EqHelper<false>::Compare<jhu::thrax::Node_const*,jhu::thrax::Node*>
            ((EqHelper<false> *)local_88,"n","actual.parent",&stack0xffffffffffffffe0,&actual.parent
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
               ,0xd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  return;
}

Assistant:

void expectNode(
    IndexType s, IndexType e, const char*l, const Node* n, Node actual) {
  Span sp{ s, e };
  EXPECT_EQ(sp, actual.span);
  EXPECT_EQ(l, actual.label);
  EXPECT_EQ(n, actual.parent);
}